

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O3

BOOL __thiscall
Js::SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_false>::FindNextProperty
          (SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_false> *this,
          ScriptContext *scriptContext,BigPropertyIndex *index,JavascriptString **propertyString,
          PropertyId *propertyId,PropertyAttributes *attributes,Type *type,
          DynamicType *typeToEnumerate,EnumeratorFlags flags,DynamicObject *instance,
          PropertyValueInfo *info)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 *puVar4;
  ushort local_32 [4];
  PropertyIndex local;
  
  local_32[0] = (ushort)*index;
  if (0x10000 < *index + 1U) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x2e6,
                                "(index <= Constants::UShortMaxValue || index == Constants::NoBigSlot)"
                                ,
                                "index <= Constants::UShortMaxValue || index == Constants::NoBigSlot"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  iVar3 = (*(this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[10])
                    (this,scriptContext,local_32,propertyString,propertyId,attributes,type,
                     typeToEnumerate,(ulong)flags,instance,info);
  *index = (uint)local_32[0];
  return iVar3;
}

Assistant:

BOOL SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::FindNextProperty(ScriptContext* scriptContext, BigPropertyIndex& index, JavascriptString** propertyString,
        PropertyId* propertyId, PropertyAttributes* attributes, Type* type, DynamicType *typeToEnumerate, EnumeratorFlags flags, DynamicObject* instance, PropertyValueInfo* info)
    {
        PropertyIndex local = (PropertyIndex)index;
        Assert(index <= Constants::UShortMaxValue || index == Constants::NoBigSlot);
        BOOL result = this->FindNextProperty(scriptContext, local, propertyString, propertyId, attributes, type, typeToEnumerate, flags, instance, info);
        index = local;
        return result;
    }